

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpccheck.cc
# Opt level: O3

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  undefined4 extraout_var;
  size_t sVar5;
  ostream *poVar6;
  string *this;
  char *__s;
  int read_size;
  long lVar7;
  bool bVar8;
  double dVar9;
  bool is_stable;
  int num_order;
  double margin;
  Buffer buffer;
  ostringstream error_message_5;
  vector<double,_std::allocator<double>_> linear_predictive_coefficients;
  ifstream ifs;
  LinearPredictiveCoefficientsStabilityCheck linear_predictive_coefficients_stability_check;
  bool local_4c5;
  int local_4c4;
  string local_4c0;
  int local_49c;
  double local_498;
  ulong local_490;
  char **local_488;
  double local_480;
  undefined1 local_478 [32];
  pointer local_458;
  undefined **local_450;
  pointer local_448;
  pointer pdStack_440;
  pointer local_438;
  pointer pdStack_430;
  pointer local_428;
  pointer pdStack_420;
  string local_418 [3];
  ios_base local_3a8 [264];
  vector<double,_std::allocator<double>_> local_2a0;
  string local_288;
  byte abStack_268 [80];
  ios_base local_218 [408];
  LinearPredictiveCoefficientsStabilityCheck local_80;
  
  local_49c = 0x19;
  local_498 = 1e-16;
  paVar1 = &local_288.field_2;
  local_4c4 = 1;
  local_490 = 0;
  local_488 = argv;
LAB_001037a4:
  while( true ) {
    iVar4 = ya_getopt_long(argc,local_488,"m:e:r:xh",(option *)0x0,(int *)0x0);
    if (iVar4 < 0x6d) break;
    if (iVar4 == 0x6d) {
      std::__cxx11::string::string((string *)&local_288,ya_optarg,(allocator *)local_418);
      bVar2 = sptk::ConvertStringToInteger(&local_288,&local_49c);
      bVar8 = local_49c < 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != paVar1) {
        operator_delete(local_288._M_dataplus._M_p);
      }
      if (!bVar2 || bVar8) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_288);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_288,"The argument for the -m option must be a ",0x29);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_288,"non-negative integer",0x14);
        local_418[0]._M_dataplus._M_p = (pointer)&local_418[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"lpccheck","");
        sptk::PrintErrorMessage(local_418,(ostringstream *)&local_288);
        goto LAB_00103fa1;
      }
    }
    else if (iVar4 == 0x72) {
      std::__cxx11::string::string((string *)&local_288,ya_optarg,(allocator *)local_418);
      bVar2 = sptk::ConvertStringToDouble(&local_288,&local_498);
      if (!bVar2 || local_498 <= 0.0) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != paVar1) {
          operator_delete(local_288._M_dataplus._M_p);
        }
        goto LAB_00103e7e;
      }
      dVar9 = local_498;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != paVar1) {
        local_480 = local_498;
        operator_delete(local_288._M_dataplus._M_p);
        dVar9 = local_480;
      }
      if (1.0 <= dVar9) {
LAB_00103e7e:
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_288);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_288,"The argument for the -r option must be in (0.0, 1.0)",0x34
                  );
        local_418[0]._M_dataplus._M_p = (pointer)&local_418[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"lpccheck","");
        sptk::PrintErrorMessage(local_418,(ostringstream *)&local_288);
LAB_00103fa1:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418[0]._M_dataplus._M_p != &local_418[0].field_2) {
          operator_delete(local_418[0]._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_288);
        std::ios_base::~ios_base(local_218);
        return 1;
      }
    }
    else {
      if (iVar4 != 0x78) goto LAB_001039c4;
      local_490 = CONCAT71((int7)(CONCAT44(extraout_var,iVar4) >> 8),1);
    }
  }
  if (iVar4 == -1) {
    if (1 < argc - ya_optind) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_288);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_288,"Too many input files",0x14);
      local_418[0]._M_dataplus._M_p = (pointer)&local_418[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"lpccheck","");
      sptk::PrintErrorMessage(local_418,(ostringstream *)&local_288);
      goto LAB_00103fa1;
    }
    if (argc == ya_optind) {
      __s = (char *)0x0;
    }
    else {
      __s = local_488[ya_optind];
    }
    bVar2 = sptk::SetBinaryMode();
    this = &local_288;
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this,"Cannot set translation mode",0x1b);
      local_418[0]._M_dataplus._M_p = (pointer)&local_418[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"lpccheck","");
      sptk::PrintErrorMessage(local_418,(ostringstream *)&local_288);
      goto LAB_00103fa1;
    }
    std::ifstream::ifstream(this);
    if ((__s != (char *)0x0) &&
       (std::ifstream::open((char *)&local_288,(_Ios_Openmode)__s),
       (abStack_268[*(long *)(local_288._M_dataplus._M_p + -0x18)] & 5) != 0)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_418);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_418,"Cannot open file ",0x11);
      sVar5 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_418,__s,sVar5);
      local_478._0_8_ = local_478 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"lpccheck","");
      sptk::PrintErrorMessage((string *)local_478,(ostringstream *)local_418);
      if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
        operator_delete((void *)local_478._0_8_);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_418);
      std::ios_base::~ios_base(local_3a8);
      iVar4 = 1;
      goto LAB_00104159;
    }
    cVar3 = std::__basic_file<char>::is_open();
    if (cVar3 == '\0') {
      this = (string *)&std::cin;
    }
    sptk::LinearPredictiveCoefficientsStabilityCheck::LinearPredictiveCoefficientsStabilityCheck
              (&local_80,local_49c,local_498);
    local_478._0_8_ = &PTR__Buffer_00110bd8;
    local_478._8_8_ = &PTR__Buffer_00110c08;
    local_478._16_8_ = 0;
    local_478._24_8_ = 0;
    local_458 = (pointer)0x0;
    local_450 = &PTR__Buffer_00110c38;
    local_448 = (pointer)0x0;
    pdStack_440 = (pointer)0x0;
    local_438 = (pointer)0x0;
    pdStack_430 = (pointer)0x0;
    local_428 = (pointer)0x0;
    pdStack_420 = (pointer)0x0;
    if (local_80.is_valid_ != false) {
      lVar7 = (long)local_49c;
      std::vector<double,_std::allocator<double>_>::vector
                (&local_2a0,lVar7 + 1U,(allocator_type *)local_418);
      iVar4 = 0;
      goto LAB_00103c11;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_418);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_418,
               "Failed to initialize LinearPredictiveCoefficientsStabilityCheck",0x3f);
    local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c0,"lpccheck","");
    sptk::PrintErrorMessage(&local_4c0,(ostringstream *)local_418);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
      operator_delete(local_4c0._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_418);
    std::ios_base::~ios_base(local_3a8);
    iVar4 = 1;
    goto LAB_0010414f;
  }
  if (iVar4 != 0x65) {
    if (iVar4 == 0x68) {
      anon_unknown.dwarf_2c2b::PrintUsage((ostream *)&std::cout);
      return 0;
    }
LAB_001039c4:
    anon_unknown.dwarf_2c2b::PrintUsage((ostream *)&std::cerr);
    return 1;
  }
  std::__cxx11::string::string((string *)&local_288,ya_optarg,(allocator *)local_418);
  bVar2 = sptk::ConvertStringToInteger(&local_288,(int *)local_478);
  if (bVar2) {
    bVar2 = sptk::IsInRange(local_478._0_4_,0,2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != paVar1) {
      operator_delete(local_288._M_dataplus._M_p);
    }
    if (bVar2) {
      local_4c4 = local_478._0_4_;
      goto LAB_001037a4;
    }
  }
  else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_288._M_dataplus._M_p != paVar1) {
    operator_delete(local_288._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_288);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_288,"The argument for the -e option must be an integer ",0x32);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_288,"in the range of ",0x10);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&local_288,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," to ",4);
  std::ostream::operator<<((ostream *)poVar6,2);
  local_418[0]._M_dataplus._M_p = (pointer)&local_418[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"lpccheck","");
  sptk::PrintErrorMessage(local_418,(ostringstream *)&local_288);
  goto LAB_00103fa1;
LAB_00103c11:
  read_size = (int)(lVar7 + 1U);
  bVar2 = sptk::ReadStream<double>(false,0,0,read_size,&local_2a0,(istream *)this,(int *)0x0);
  if (!bVar2) {
    iVar4 = 0;
LAB_0010413d:
    if (local_2a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
LAB_0010414f:
    sptk::LinearPredictiveCoefficientsStabilityCheck::Buffer::~Buffer((Buffer *)local_478);
LAB_00104159:
    std::ifstream::~ifstream(&local_288);
    return iVar4;
  }
  local_4c5 = false;
  if ((local_490 & 1) != 0) {
    bVar2 = sptk::LinearPredictiveCoefficientsStabilityCheck::Run
                      (&local_80,&local_2a0,&local_4c5,(Buffer *)local_478);
    if (bVar2) {
      bVar2 = sptk::LinearPredictiveCoefficientsStabilityCheck::Run
                        (&local_80,&local_2a0,(vector<double,_std::allocator<double>_> *)0x0,
                         &local_4c5,(Buffer *)local_478);
      if (bVar2) {
        if (local_4c4 != 0 && (local_4c5 & 1U) == 0) goto LAB_00103ca7;
        goto LAB_00103d34;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_418);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_418,"Failed to check stability of linear predictive coefficients",
                 0x3b);
      local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c0,"lpccheck","");
      sptk::PrintErrorMessage(&local_4c0,(ostringstream *)local_418);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_418);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_418,"Failed to check stability of linear predictive coefficients",
                 0x3b);
      local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c0,"lpccheck","");
      sptk::PrintErrorMessage(&local_4c0,(ostringstream *)local_418);
    }
LAB_00104103:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
      operator_delete(local_4c0._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_418);
    std::ios_base::~ios_base(local_3a8);
LAB_00104138:
    iVar4 = 1;
    goto LAB_0010413d;
  }
  if (local_4c4 != 0) {
LAB_00103ca7:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_418);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_418,iVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"th frame is unstable",0x14);
    local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c0,"lpccheck","");
    sptk::PrintErrorMessage(&local_4c0,(ostringstream *)local_418);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
      operator_delete(local_4c0._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_418);
    std::ios_base::~ios_base(local_3a8);
    if (local_4c4 != 2) goto LAB_00103d34;
    goto LAB_00104138;
  }
LAB_00103d34:
  bVar2 = sptk::WriteStream<double>(0,read_size,&local_2a0,(ostream *)&std::cout,(int *)0x0);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_418);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_418,"Failed to write linear predictive coefficients",0x2e);
    local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c0,"lpccheck","");
    sptk::PrintErrorMessage(&local_4c0,(ostringstream *)local_418);
    goto LAB_00104103;
  }
  iVar4 = iVar4 + 1;
  goto LAB_00103c11;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_order(kDefaultNumOrder);
  WarningType warning_type(kDefaultWarningType);
  double margin(kDefaultMargin);
  bool modification_flag(kDefaultModificationFlag);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "m:e:r:xh", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("lpccheck", error_message);
          return 1;
        }
        break;
      }
      case 'e': {
        const int min(0);
        const int max(static_cast<int>(kNumWarningTypes) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -e option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("lpccheck", error_message);
          return 1;
        }
        warning_type = static_cast<WarningType>(tmp);
        break;
      }
      case 'r': {
        if (!sptk::ConvertStringToDouble(optarg, &margin) || margin <= 0.0 ||
            1.0 <= margin) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -r option must be in (0.0, 1.0)";
          sptk::PrintErrorMessage("lpccheck", error_message);
          return 1;
        }
        break;
      }
      case 'x': {
        modification_flag = true;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_rest_args(argc - optind);
  if (1 < num_rest_args) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("lpccheck", error_message);
    return 1;
  }
  const char* input_file(0 == num_rest_args ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("lpccheck", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("lpccheck", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::LinearPredictiveCoefficientsStabilityCheck
      linear_predictive_coefficients_stability_check(num_order, margin);
  sptk::LinearPredictiveCoefficientsStabilityCheck::Buffer buffer;
  if (!linear_predictive_coefficients_stability_check.IsValid()) {
    std::ostringstream error_message;
    error_message
        << "Failed to initialize LinearPredictiveCoefficientsStabilityCheck";
    sptk::PrintErrorMessage("lpccheck", error_message);
    return 1;
  }

  const int length(num_order + 1);
  std::vector<double> linear_predictive_coefficients(length);

  for (int frame_index(0);
       sptk::ReadStream(false, 0, 0, length, &linear_predictive_coefficients,
                        &input_stream, NULL);
       ++frame_index) {
    bool is_stable(false);
    if (modification_flag) {
      if (!linear_predictive_coefficients_stability_check.Run(
              &linear_predictive_coefficients, &is_stable, &buffer)) {
        std::ostringstream error_message;
        error_message
            << "Failed to check stability of linear predictive coefficients";
        sptk::PrintErrorMessage("lpccheck", error_message);
        return 1;
      } else {
        if (!linear_predictive_coefficients_stability_check.Run(
                linear_predictive_coefficients, NULL, &is_stable, &buffer)) {
          std::ostringstream error_message;
          error_message
              << "Failed to check stability of linear predictive coefficients";
          sptk::PrintErrorMessage("lpccheck", error_message);
          return 1;
        }
      }
    }

    if (!is_stable && kIgnore != warning_type) {
      std::ostringstream error_message;
      error_message << frame_index << "th frame is unstable";
      sptk::PrintErrorMessage("lpccheck", error_message);
      if (kExit == warning_type) return 1;
    }

    if (!sptk::WriteStream(0, length, linear_predictive_coefficients,
                           &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write linear predictive coefficients";
      sptk::PrintErrorMessage("lpccheck", error_message);
      return 1;
    }
  }

  return 0;
}